

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToZip
          (GeneratorContextImpl *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  ostream *poVar4;
  string *in_RSI;
  long in_RDI;
  bool bVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  ZipWriter zip_writer;
  FileOutputStream stream;
  int error;
  int file_descriptor;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffec8;
  FileOutputStream *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  _Self local_b8;
  _Self local_b0;
  long local_a8;
  ZipWriter *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  ZipWriter *in_stack_ffffffffffffff80;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    do {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = open(pcVar2,0x241,0x1b6);
      bVar5 = false;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        bVar5 = *piVar3 == 4;
      }
    } while (bVar5);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      poVar4 = std::operator<<((ostream *)&std::cerr,in_RSI);
      poVar4 = std::operator<<(poVar4,": ");
      pcVar2 = strerror(iVar1);
      std::operator<<(poVar4,pcVar2);
      local_1 = false;
    }
    else {
      io::FileOutputStream::FileOutputStream
                ((FileOutputStream *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8);
      ZipWriter::ZipWriter
                ((ZipWriter *)in_stack_fffffffffffffed0,
                 (ZeroCopyOutputStream *)in_stack_fffffffffffffec8);
      local_a8 = in_RDI + 8;
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(in_stack_fffffffffffffec8);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_fffffffffffffec8);
      while (bVar5 = std::operator!=(&local_b0,&local_b8), bVar5) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x40fef3);
        ZipWriter::Write(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         in_stack_ffffffffffffff70);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffed0);
      }
      ZipWriter::WriteDirectory(in_stack_ffffffffffffff60);
      iVar1 = io::FileOutputStream::GetErrno((FileOutputStream *)0x40ff7f);
      if (iVar1 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,in_RSI);
        poVar4 = std::operator<<(poVar4,": ");
        iVar1 = io::FileOutputStream::GetErrno((FileOutputStream *)0x40ffce);
        pcVar2 = strerror(iVar1);
        poVar4 = std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      bVar5 = io::FileOutputStream::Close(in_stack_fffffffffffffed0);
      if (!bVar5) {
        poVar4 = std::operator<<((ostream *)&std::cerr,in_RSI);
        poVar4 = std::operator<<(poVar4,": ");
        iVar1 = io::FileOutputStream::GetErrno((FileOutputStream *)0x410063);
        pcVar2 = strerror(iVar1);
        in_stack_fffffffffffffed0 = (FileOutputStream *)std::operator<<(poVar4,pcVar2);
        std::ostream::operator<<(in_stack_fffffffffffffed0,std::endl<char,std::char_traits<char>>);
      }
      local_1 = true;
      ZipWriter::~ZipWriter((ZipWriter *)0x4100b0);
      io::FileOutputStream::~FileOutputStream(in_stack_fffffffffffffed0);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToZip(
    const std::string& filename) {
  if (had_error_) {
    return false;
  }

  // Create the output file.
  int file_descriptor;
  do {
    file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (file_descriptor < 0 && errno == EINTR);

  if (file_descriptor < 0) {
    int error = errno;
    std::cerr << filename << ": " << strerror(error);
    return false;
  }

  // Create the ZipWriter
  io::FileOutputStream stream(file_descriptor);
  ZipWriter zip_writer(&stream);

  for (const auto& pair : files_) {
    zip_writer.Write(pair.first, pair.second);
  }

  zip_writer.WriteDirectory();

  if (stream.GetErrno() != 0) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
  }

  if (!stream.Close()) {
    std::cerr << filename << ": " << strerror(stream.GetErrno()) << std::endl;
  }

  return true;
}